

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O1

void __thiscall FormatTest_ToWString_Test::TestBody(FormatTest_ToWString_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  AssertHelper local_40;
  internal local_38 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  wstring local_28;
  
  local_40.data_._0_4_ = 0x2a;
  fmt::v5::to_wstring<int>(&local_28,(int *)&local_40);
  testing::internal::CmpHelperEQ<wchar_t[3],std::__cxx11::wstring>
            (local_38,"L\"42\"","fmt::to_wstring(42)",(wchar_t (*) [3])L"42",&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p);
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x7f3,message);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_28._M_dataplus._M_p != (pointer)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_28._M_dataplus._M_p != (pointer)0x0)) {
        (**(code **)(*(long *)local_28._M_dataplus._M_p + 8))();
      }
      local_28._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(FormatTest, ToWString) {
  EXPECT_EQ(L"42", fmt::to_wstring(42));
}